

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string2.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  String local_88;
  value_type local_80;
  undefined1 local_78 [8];
  vector<String,_std::allocator<String>_> svec;
  String s4;
  String local_50;
  String local_48;
  String local_40;
  String local_38;
  String s3;
  String s2;
  String s1;
  String local_10;
  String s0;
  
  String::String(&local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp1----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  String::String(&s2,"hello");
  poVar1 = std::operator<<((ostream *)&std::cout,"tp2----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  String::String(&s3,&local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp3----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  String::String(&local_38,&s2);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp4----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  String::String(&local_40,&s2);
  String::operator=(&s3,&local_40);
  String::~String(&local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp5----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  String::String(&local_48,&s2);
  foo(&local_48);
  String::~String(&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp6----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  bar(&s2);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp7----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  String::String(&local_50,"temporary");
  foo(&local_50);
  String::~String(&local_50);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp8----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  String::String(&s4,"temporary");
  bar(&s4);
  String::~String(&s4);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp9----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  baz();
  poVar1 = std::operator<<((ostream *)&std::cout,"tp10---------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<String,_std::allocator<String>_>::vector
            ((vector<String,_std::allocator<String>_> *)local_78);
  std::vector<String,_std::allocator<String>_>::push_back
            ((vector<String,_std::allocator<String>_> *)local_78,&local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp11----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<String,_std::allocator<String>_>::push_back
            ((vector<String,_std::allocator<String>_> *)local_78,&s2);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp12----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  baz();
  std::vector<String,_std::allocator<String>_>::push_back
            ((vector<String,_std::allocator<String>_> *)local_78,&local_80);
  String::~String(&local_80);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp13----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  String::String(&local_88,"good job");
  std::vector<String,_std::allocator<String>_>::push_back
            ((vector<String,_std::allocator<String>_> *)local_78,&local_88);
  String::~String(&local_88);
  poVar1 = std::operator<<((ostream *)&std::cout,"tp14----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<String,std::allocator<String>>::emplace_back<char_const(&)[14]>
            ((vector<String,std::allocator<String>> *)local_78,(char (*) [14])"c++11 emplace");
  poVar1 = std::operator<<((ostream *)&std::cout,"tp15----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<String,_std::allocator<String>_>::~vector
            ((vector<String,_std::allocator<String>_> *)local_78);
  String::~String((String *)
                  &svec.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  String::~String(&local_38);
  String::~String(&s3);
  String::~String(&s2);
  String::~String(&local_10);
  return 0;
}

Assistant:

int main()
{
  String s0;
  std::cout << "tp1----------------------" << std::endl;
  String s1("hello");
  std::cout << "tp2----------------------" << std::endl;
  String s2(s0);
  std::cout << "tp3----------------------" << std::endl;
  String s3 = s1;
  std::cout << "tp4----------------------" << std::endl;
  s2 = s1;
  std::cout << "tp5----------------------" << std::endl;

  foo(s1);
  std::cout << "tp6----------------------" << std::endl;
  bar(s1);
  std::cout << "tp7----------------------" << std::endl;
  foo("temporary");
  std::cout << "tp8----------------------" << std::endl;
  bar("temporary");
  std::cout << "tp9----------------------" << std::endl;
  String s4 = baz();
  std::cout << "tp10---------------------" << std::endl;

  std::vector<String> svec;
  // void std::vector<String>::push_back(const String& __x)
  svec.push_back(s0);
  std::cout << "tp11----------------------" << std::endl;
  svec.push_back(s1);
  std::cout << "tp12----------------------" << std::endl;
  // void std::vector<String>::push_back(String&& __x)
  svec.push_back(baz());
  std::cout << "tp13----------------------" << std::endl;
  // void std::vector<String>::push_back(String&& __x)
  svec.push_back("good job");
  std::cout << "tp14----------------------" << std::endl;
  svec.emplace_back("c++11 emplace"); // Effective Modern C++ Item42
  std::cout << "tp15----------------------" << std::endl;
}